

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_24(QPDF *pdf,char *arg2)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  char *pcVar6;
  QPDFObjectHandle QVar7;
  QPDFObjectHandle QVar8;
  QPDFObjectHandle QVar9;
  QPDFObjectHandle QVar10;
  QPDFWriter w;
  QPDFObjectHandle res1;
  QPDFObjectHandle res2;
  QPDFObjectHandle array1;
  QPDFObjectHandle array2;
  QPDFObjectHandle trailer;
  QPDFWriter local_100 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  undefined8 local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  undefined8 local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d8;
  QPDFObjectHandle local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_c0;
  undefined1 local_b0 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  QPDFObjectHandle local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  undefined8 local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  undefined8 local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  long *local_40;
  long local_30 [2];
  
  QPDFObjectHandle::newReserved((QPDF *)&local_f0);
  QPDFObjectHandle::newReserved((QPDF *)&local_e0);
  QPDF::getTrailer();
  local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Array1","");
  QPDFObjectHandle::replaceKey(local_50,&local_d0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != &local_c0) {
    operator_delete(local_d0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_c0._vptr__Sp_counted_base + 1);
  }
  local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"Array2","");
  QPDFObjectHandle::replaceKey(local_50,&local_d0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != &local_c0) {
    operator_delete(local_d0.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    (long)local_c0._vptr__Sp_counted_base + 1);
  }
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::newArray();
  QPDFObjectHandle::appendItem(&local_d0);
  QPDFObjectHandle::newInteger((longlong)local_100);
  QPDFObjectHandle::appendItem(&local_d0);
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  QPDFObjectHandle::appendItem(&local_a0);
  QPDFObjectHandle::newInteger((longlong)local_100);
  QPDFObjectHandle::appendItem(&local_a0);
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  cVar1 = QPDFObjectHandle::isArray();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"oops -- res1 is an array",0x18);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  cVar1 = QPDFObjectHandle::isReserved();
  if (cVar1 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"res1 is still reserved after checking if array",0x2e);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  local_60 = local_f0;
  local_58 = local_e8;
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_e8->_M_use_count = local_e8->_M_use_count + 1;
    }
  }
  local_70 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_d0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_68 = local_d0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                local_d0.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var5._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_60;
  QVar7.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  QVar9.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_70;
  QPDF::replaceReserved(QVar7,QVar9);
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  bVar2 = QPDFObjectHandle::isReserved();
  pcVar6 = "res1 is no longer reserved";
  if (bVar2 != 0) {
    pcVar6 = "oops -- res1 is still reserved";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar6,(ulong)bVar2 * 4 + 0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::assertArray();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"res1 is an array",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::unparseResolved_abi_cxx11_();
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::makeDirect(SUB81(&local_e0,0));
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"oops -- didn\'t throw",0x14);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  local_80 = local_e0;
  local_78 = local_d8;
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_d8->_M_use_count = local_d8->_M_use_count + 1;
    }
  }
  local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88 = local_a0.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_80;
  QVar8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdf;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  QVar10.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&local_90;
  QPDF::replaceReserved(QVar8,QVar10);
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  QPDFObjectHandle::assertArray();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"res2 is an array",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  QPDFObjectHandle::getArrayItem((int)local_b0);
  QPDFObjectHandle::getArrayItem((int)local_100);
  iVar3 = QPDFObjectHandle::getIntValueAsInt();
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  QPDFObjectHandle::getArrayItem((int)local_b0);
  QPDFObjectHandle::getArrayItem((int)local_100);
  iVar4 = QPDFObjectHandle::getIntValueAsInt();
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (iVar4 == 1 && iVar3 == 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"circular access and lazy resolution worked",0x2a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
  }
  QPDFWriter::QPDFWriter(local_100,pdf,"a.pdf");
  QPDFWriter::setStaticID(false);
  QPDFWriter::setStreamDataMode((qpdf_stream_data_e)local_100);
  QPDFWriter::write();
  if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8);
  }
  if (local_a0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
  }
  if (local_d8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8);
  }
  if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
  }
  return;
}

Assistant:

static void
test_24(QPDF& pdf, char const* arg2)
{
    // Test behavior of reserved objects
    QPDFObjectHandle res1 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle res2 = QPDFObjectHandle::newReserved(&pdf);
    QPDFObjectHandle trailer = pdf.getTrailer();
    trailer.replaceKey("Array1", res1);
    trailer.replaceKey("Array2", res2);

    QPDFObjectHandle array1 = QPDFObjectHandle::newArray();
    QPDFObjectHandle array2 = QPDFObjectHandle::newArray();
    array1.appendItem(res2);
    array1.appendItem(QPDFObjectHandle::newInteger(1));
    array2.appendItem(res1);
    array2.appendItem(QPDFObjectHandle::newInteger(2));
    // Make sure trying to ask questions about a reserved object
    // doesn't break it.
    if (res1.isArray()) {
        std::cout << "oops -- res1 is an array" << std::endl;
    }
    if (res1.isReserved()) {
        std::cout << "res1 is still reserved after checking if array" << std::endl;
    }
    pdf.replaceReserved(res1, array1);
    if (res1.isReserved()) {
        std::cout << "oops -- res1 is still reserved" << std::endl;
    } else {
        std::cout << "res1 is no longer reserved" << std::endl;
    }
    res1.assertArray();
    std::cout << "res1 is an array" << std::endl;

    try {
        res2.unparseResolved();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }
    try {
        res2.makeDirect();
        std::cout << "oops -- didn't throw" << std::endl;
    } catch (std::logic_error const& e) {
        std::cout << "logic error: " << e.what() << std::endl;
    }

    pdf.replaceReserved(res2, array2);

    res2.assertArray();
    std::cout << "res2 is an array" << std::endl;

    // Verify that the previously added reserved keys can be
    // dereferenced properly now
    int i1 = res1.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    int i2 = res2.getArrayItem(0).getArrayItem(1).getIntValueAsInt();
    if ((i1 == 2) && (i2 == 1)) {
        std::cout << "circular access and lazy resolution worked" << std::endl;
    }

    QPDFWriter w(pdf, "a.pdf");
    w.setStaticID(true);
    w.setStreamDataMode(qpdf_s_preserve);
    w.write();
}